

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_block.cpp
# Opt level: O1

uint32_t __thiscall
cppnet::BufferBlock::Write(BufferBlock *this,shared_ptr<cppnet::InnerBuffer> *buffer,uint32_t len)

{
  char *pcVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ulong uVar3;
  _func_int *p_Var4;
  int iVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  undefined8 uVar9;
  uint uVar10;
  uint uVar11;
  
  if (len == 0) {
    len = (*(((buffer->super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
            ->super_Buffer)._vptr_Buffer[8])();
  }
  pcVar1 = this->_buffer_start;
  if (pcVar1 == (char *)0x0) {
    return 0;
  }
  if ((this->_can_read == false) && (this->_read == this->_write)) {
    this->_read = pcVar1;
    this->_write = pcVar1;
  }
  peVar2 = (buffer->super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar2 == (element_type *)0x0) {
    lVar7 = 0;
  }
  else {
    lVar7 = __dynamic_cast(peVar2,&InnerBuffer::typeinfo,&typeinfo,0);
  }
  this_00 = (buffer->super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  uVar8 = *(ulong *)(lVar7 + 0x38);
  uVar3 = *(ulong *)(lVar7 + 0x40);
  if (uVar8 < uVar3) {
    uVar10 = (int)uVar3 - (int)uVar8;
LAB_00121197:
    uVar11 = 0;
    uVar9 = 0;
  }
  else {
    if ((uVar8 == uVar3) && (*(char *)(lVar7 + 0x58) == '\0')) {
      uVar8 = 0;
      uVar10 = 0;
      goto LAB_00121197;
    }
    uVar10 = *(int *)(lVar7 + 0x50) - (int)uVar8;
    uVar11 = (int)uVar3 - (int)*(undefined8 *)(lVar7 + 0x48);
    uVar9 = 0;
    if (uVar11 != 0) {
      uVar9 = *(undefined8 *)(lVar7 + 0x48);
    }
  }
  if (len < uVar10 + uVar11) {
    p_Var4 = (this->super_InnerBuffer).super_Buffer._vptr_Buffer[10];
    if (len < uVar10) {
      uVar10 = (*p_Var4)(this,uVar8,(ulong)len);
      goto LAB_0012120a;
    }
    iVar5 = (*p_Var4)(this);
    iVar6 = (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[10])
                      (this,uVar9,(ulong)(len - uVar10));
  }
  else {
    iVar5 = (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[10])(this,uVar8);
    iVar6 = (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[10])(this,uVar9,(ulong)uVar11);
  }
  uVar10 = iVar6 + iVar5;
LAB_0012120a:
  peVar2 = (buffer->super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (*(peVar2->super_Buffer)._vptr_Buffer[6])(peVar2,(ulong)uVar10);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return uVar10;
}

Assistant:

uint32_t BufferBlock::Write(std::shared_ptr<InnerBuffer> buffer, uint32_t len) {
    if (len == 0) {
        len = buffer->GetCanReadLength();
    }

    if (!_buffer_start) {
        return 0;
    }

    if(!_can_read && _read == _write) {
        _write = _read = _buffer_start;
    }

    void* data1 = nullptr, *data2 = nullptr;
    uint32_t len1 = 0, len2 = 0;

    std::shared_ptr<BufferBlock> block_buffer = std::dynamic_pointer_cast<BufferBlock>(buffer);
    block_buffer->GetUseMemoryBlock(data1, len1, data2, len2);
    uint32_t total_size = len1 + len2;
    uint32_t write_done_size = 0;
    
    // write all data
    if (len >= total_size) {
        write_done_size += Write((char*)data1, len1);
        write_done_size += Write((char*)data2, len2);

    // write part of data
    } else if (len < total_size && len >= len1) {
        write_done_size += Write((char*)data1, len1);
        write_done_size += Write((char*)data2, len - len1);

    // write part of data
    } else {
        write_done_size += Write((char*)data1, len);
    }

    buffer->MoveReadPt(write_done_size);
    return write_done_size;
}